

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O0

int __thiscall
helics::zeromq::ZmqCommsSS::initializeBrokerConnections
          (ZmqCommsSS *this,socket_t *brokerSocket,socket_t *brokerConnection)

{
  string_view message;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int __fd;
  CommsInterface *in_RSI;
  long in_RDI;
  int ret;
  bool bindsuccess;
  socket_t *in_stack_000001f0;
  ZmqCommsSS *in_stack_000001f8;
  int in_stack_ffffffffffffff0c;
  undefined1 __i;
  socket_base *in_stack_ffffffffffffff10;
  __atomic_base<int> *in_stack_ffffffffffffff18;
  __atomic_base<int> *this_01;
  ConnectionStatus status;
  CommsInterface *this_02;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  CommsInterface *in_stack_ffffffffffffff80;
  milliseconds in_stack_ffffffffffffff88;
  milliseconds in_stack_ffffffffffffff90;
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x25b) & 1) != 0) {
    zmq::detail::socket_base::setsockopt<int>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,(int *)0x4db78e);
    __i = (undefined1)((uint)in_stack_ffffffffffffff0c >> 0x18);
    __fd = (int)in_RDI + 0xf0;
    this_02 = in_RSI;
    std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff18);
    bVar1 = bindzmqSocket((socket_t *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff74,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff88);
    if (!bVar1) {
      zmq::socket_t::close((socket_t *)in_RSI,__fd);
      CLI::std::atomic<bool>::operator=((atomic<bool> *)in_stack_ffffffffffffff10,(bool)__i);
      this_01 = (__atomic_base<int> *)&stack0xffffffffffffff77;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xf0)
      ;
      std::__atomic_base::operator_cast_to_int(this_01);
      status = (ConnectionStatus)((ulong)this_01 >> 0x20);
      gmlc::networking::makePortAddress
                ((string *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      std::operator+(in_stack_ffffffffffffff48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
      message._M_str = (char *)in_stack_ffffffffffffff90.__r;
      message._M_len = in_stack_ffffffffffffff88.__r;
      CommsInterface::logError(in_stack_ffffffffffffff80,message);
      std::__cxx11::string::~string(this_00);
      std::__cxx11::string::~string(this_00);
      std::__cxx11::string::~string(this_00);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
      CommsInterface::setRxStatus(this_02,status);
      return -1;
    }
  }
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff18);
  if ((!bVar1) ||
     (local_4 = initializeConnectionToBroker(in_stack_000001f8,in_stack_000001f0), local_4 == 0)) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ZmqCommsSS::initializeBrokerConnections(zmq::socket_t& brokerSocket,
                                            zmq::socket_t& brokerConnection)
{
    if (serverMode) {
        brokerSocket.setsockopt(ZMQ_LINGER, 500);
        auto bindsuccess =
            bindzmqSocket(brokerSocket, localTargetAddress, PortNumber, connectionTimeout);
        if (!bindsuccess) {
            brokerSocket.close();
            disconnecting = true;
            logError(std::string("Unable to bind zmq router socket giving up ") +
                     gmlc::networking::makePortAddress(localTargetAddress, PortNumber));
            setRxStatus(ConnectionStatus::ERRORED);
            return -1;
        }
    }
    if (hasBroker) {
        auto ret = initializeConnectionToBroker(brokerConnection);
        if (ret != 0) {
            return ret;
        }
    }
    return 0;
}